

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QString,QString>>::emplace<std::pair<QString,QString>>
          (QMovableArrayOps<std::pair<QString,_QString>_> *this,qsizetype i,
          pair<QString,_QString> *args)

{
  undefined1 uVar1;
  qsizetype qVar2;
  long in_RSI;
  QArrayDataPointer<std::pair<QString,_QString>_> *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  pair<QString,_QString> tmp;
  pair<QString,_QString> *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined1 uVar3;
  Inserter *in_stack_ffffffffffffff70;
  GrowthPosition in_stack_ffffffffffffff7c;
  undefined2 in_stack_ffffffffffffff84;
  byte bVar4;
  Inserter local_60;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<std::pair<QString,_QString>_>::needsDetach
                    ((QArrayDataPointer<std::pair<QString,_QString>_> *)
                     CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->size) &&
       (qVar2 = QArrayDataPointer<std::pair<QString,_QString>_>::freeSpaceAtEnd(in_RDI), qVar2 != 0)
       ) {
      QArrayDataPointer<std::pair<QString,_QString>_>::end
                ((QArrayDataPointer<std::pair<QString,_QString>_> *)
                 CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      std::pair<QString,_QString>::pair
                ((pair<QString,_QString> *)
                 CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0031925c;
    }
    if ((in_RSI == 0) &&
       (qVar2 = QArrayDataPointer<std::pair<QString,_QString>_>::freeSpaceAtBegin(in_RDI),
       qVar2 != 0)) {
      QArrayDataPointer<std::pair<QString,_QString>_>::begin
                ((QArrayDataPointer<std::pair<QString,_QString>_> *)0x31909a);
      std::pair<QString,_QString>::pair
                ((pair<QString,_QString> *)
                 CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0031925c;
    }
  }
  memset(&local_38,0,0x30);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  std::pair<QString,_QString>::pair
            ((pair<QString,_QString> *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60)
             ,in_stack_ffffffffffffff58);
  uVar3 = in_RDI->size != 0 && in_RSI == 0;
  bVar4 = uVar3;
  QArrayDataPointer<std::pair<QString,_QString>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<QString,_QString>_> *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT24(in_stack_ffffffffffffff84,(uint)(byte)uVar3))),
             in_stack_ffffffffffffff7c,(qsizetype)in_stack_ffffffffffffff70,
             (pair<QString,_QString> **)in_RDI,
             (QArrayDataPointer<std::pair<QString,_QString>_> *)
             CONCAT17(uVar3,in_stack_ffffffffffffff60));
  if ((bVar4 & 1) == 0) {
    QMovableArrayOps<std::pair<QString,_QString>_>::Inserter::Inserter
              (in_stack_ffffffffffffff70,in_RDI,CONCAT17(uVar3,in_stack_ffffffffffffff60),
               (qsizetype)in_stack_ffffffffffffff58);
    QMovableArrayOps<std::pair<QString,_QString>_>::Inserter::insertOne
              ((Inserter *)CONCAT17(uVar3,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58);
    QMovableArrayOps<std::pair<QString,_QString>_>::Inserter::~Inserter(&local_60);
  }
  else {
    QArrayDataPointer<std::pair<QString,_QString>_>::begin
              ((QArrayDataPointer<std::pair<QString,_QString>_> *)0x3191b8);
    std::pair<QString,_QString>::pair
              ((pair<QString,_QString> *)CONCAT17(uVar3,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
  std::pair<QString,_QString>::~pair
            ((pair<QString,_QString> *)CONCAT17(uVar3,in_stack_ffffffffffffff60));
LAB_0031925c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }